

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

DWORD __thiscall TSparseArray::FindGroup_Items1(TSparseArray *this,DWORD index)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  char *__function;
  uint uVar4;
  ulong uVar5;
  _BASEVALS *p_Var6;
  
  uVar3 = index >> 9;
  uVar4 = (this->IndexToItem1).ItemCount;
  if ((uVar3 < uVar4) && (uVar3 + 1 < uVar4)) {
    puVar1 = (this->IndexToItem1).ItemArray;
    uVar4 = puVar1[uVar3];
    uVar2 = uVar4 >> 9;
    uVar3 = puVar1[uVar3 + 1] + 0x1ff >> 9;
    if (uVar3 - uVar2 < 10) {
      uVar4 = uVar4 >> 9;
      uVar5 = (ulong)uVar4;
      uVar2 = uVar4 - 1;
      p_Var6 = (this->BaseVals).ItemArray + uVar5;
      do {
        p_Var6 = p_Var6 + 1;
        uVar5 = uVar5 + 1;
        if ((this->BaseVals).ItemCount <= uVar5) goto LAB_0011790e;
        uVar2 = uVar2 + 1;
      } while (p_Var6->BaseValue200 <= index);
    }
    else if (uVar2 + 1 < uVar3) {
      uVar4 = uVar3 + uVar2 >> 1;
      if ((this->BaseVals).ItemCount <= uVar4) {
LAB_0011790e:
        __function = "T &TGenericArray<_BASEVALS>::operator[](size_t) [T = _BASEVALS]";
        goto LAB_00117923;
      }
      if ((this->BaseVals).ItemArray[uVar4].BaseValue200 <= index) {
        uVar2 = uVar4;
      }
    }
    return uVar2;
  }
  __function = "T &TGenericArray<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_00117923:
  __assert_fail("index < ItemCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                ,0x1d0,__function);
}

Assistant:

DWORD FindGroup_Items1(DWORD index)
    {
        DWORD groupIndex = (index >> 0x09);
        DWORD startValue = IndexToItem1[groupIndex] >> 9;
        DWORD nextValue = (IndexToItem1[groupIndex + 1] + 0x1FF) >> 9;

        // Find the BASEVALS structure which the start index belongs to
        // For less than 10 values, use sequential search. Otherwise, use binary search
        if ((nextValue - startValue) < 10)
        {
            // HOTS: 01959F94
            while (index >= BaseVals[startValue + 1].BaseValue200)
            {
                // HOTS: 1959FA3
                startValue++;
            }
        }
        else
        {
            // Binary search (HOTS: 1959FAD)
            if ((startValue + 1) < nextValue)
            {
                // HOTS: 1959FB4
                DWORD middleValue = (nextValue + startValue) >> 1;

                if (index < BaseVals[middleValue].BaseValue200)
                {
                    // HOTS: 1959FC4
                    nextValue = middleValue;
                }
                else
                {
                    // HOTS: 1959FC8
                    startValue = middleValue;
                }
            }
        }

        return startValue;
    }